

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict2pid.c
# Opt level: O3

void dict2pid_dump(FILE *fp,dict2pid_t *d2p,mdef_t *mdef,dict_t *dict)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  fwrite("# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n",0x33,1,(FILE *)fp);
  if (0 < dict->n_word) {
    lVar6 = 0;
    do {
      fprintf((FILE *)fp,"%30s ",dict->word[lVar6].word);
      lVar8 = (long)dict->word[lVar6].pronlen;
      if (0 < lVar8) {
        lVar9 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)d2p->internal[lVar6][lVar9]);
          lVar9 = lVar9 + 1;
        } while (lVar8 != lVar9);
      }
      fputc(10,(FILE *)fp);
      lVar6 = lVar6 + 1;
    } while (lVar6 < dict->n_word);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# LDIPH_LC (b r l ssid)\n",0x18,1,(FILE *)fp);
  iVar2 = mdef->n_ciphone;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          if (0 < iVar2) {
            lVar9 = 0;
            do {
              if (-1 < d2p->ldiph_lc[lVar6][lVar8][lVar9]) {
                pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar6);
                pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)lVar8);
                pcVar5 = mdef_ciphone_str(mdef,(s3cipid_t)lVar9);
                fprintf((FILE *)fp,"%6s %6s %6s %5d\n",pcVar3,pcVar4,pcVar5,
                        (ulong)(uint)d2p->ldiph_lc[lVar6][lVar8][lVar9]);
                iVar2 = mdef->n_ciphone;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 < iVar2);
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# SINGLE_LC (b l comssid)\n",0x1a,1,(FILE *)fp);
  iVar2 = mdef->n_ciphone;
  if (0 < iVar2) {
    lVar6 = 0;
    do {
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          if (-1 < d2p->single_lc[lVar6][lVar8]) {
            pcVar3 = mdef_ciphone_str(mdef,(s3cipid_t)lVar6);
            pcVar4 = mdef_ciphone_str(mdef,(s3cipid_t)lVar8);
            fprintf((FILE *)fp,"%6s %6s %5d\n",pcVar3,pcVar4,
                    (ulong)(uint)d2p->single_lc[lVar6][lVar8]);
            iVar2 = mdef->n_ciphone;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar2);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar2);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# SSEQ %d (senid senid ...)\n",(ulong)(uint)mdef->n_sseq);
  if (0 < mdef->n_sseq) {
    uVar7 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar7 & 0xffffffff);
      if (0 < mdef->n_emit_state) {
        lVar6 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)(int)mdef->sseq[uVar7][lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < mdef->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)mdef->n_sseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSSEQ %d (comstate comstate ...)\n",(ulong)(uint)d2p->n_comsseq);
  if (0 < d2p->n_comsseq) {
    uVar7 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar7 & 0xffffffff);
      if (0 < mdef->n_emit_state) {
        lVar6 = 0;
        do {
          fprintf((FILE *)fp," %5d",(ulong)(uint)(int)d2p->comsseq[uVar7][lVar6]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < mdef->n_emit_state);
      }
      fputc(10,(FILE *)fp);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)d2p->n_comsseq);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fprintf((FILE *)fp,"# COMSTATE %d (senid senid ...)\n",(ulong)(uint)d2p->n_comstate);
  if (0 < d2p->n_comstate) {
    uVar7 = 0;
    do {
      fprintf((FILE *)fp,"%5d ",uVar7 & 0xffffffff);
      uVar1 = *d2p->comstate[uVar7];
      if (-1 < (short)uVar1) {
        lVar6 = 2;
        do {
          fprintf((FILE *)fp," %5d",(ulong)uVar1);
          uVar1 = *(ushort *)((long)d2p->comstate[uVar7] + lVar6);
          lVar6 = lVar6 + 2;
        } while (-1 < (short)uVar1);
      }
      fputc(10,(FILE *)fp);
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)d2p->n_comstate);
  }
  fwrite("#\n",2,1,(FILE *)fp);
  fwrite("# END\n",6,1,(FILE *)fp);
  fflush((FILE *)fp);
  return;
}

Assistant:

void
dict2pid_dump(FILE * fp, dict2pid_t * d2p, mdef_t * mdef, dict_t * dict)
{
    int32 w, p, pronlen;
    int32 i, j, b, l, r;

    fprintf(fp, "# INTERNAL (wd comssid ssid ssid ... ssid comssid)\n");
    for (w = 0; w < dict_size(dict); w++) {
        fprintf(fp, "%30s ", dict_wordstr(dict, w));

        pronlen = dict_pronlen(dict, w);
        for (p = 0; p < pronlen; p++)
            fprintf(fp, " %5d", d2p->internal[w][p]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# LDIPH_LC (b r l ssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (r = 0; r < mdef_n_ciphone(mdef); r++) {
            for (l = 0; l < mdef_n_ciphone(mdef); l++) {
                if (IS_S3SSID(d2p->ldiph_lc[b][r][l]))
                    fprintf(fp, "%6s %6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) r), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->ldiph_lc[b][r][l]);      /* RAH, ldiph_lc is returning an int32, %d expects an int16 */
            }
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SINGLE_LC (b l comssid)\n");
    for (b = 0; b < mdef_n_ciphone(mdef); b++) {
        for (l = 0; l < mdef_n_ciphone(mdef); l++) {
            if (IS_S3SSID(d2p->single_lc[b][l]))
                fprintf(fp, "%6s %6s %5d\n", mdef_ciphone_str(mdef, (s3cipid_t) b), mdef_ciphone_str(mdef, (s3cipid_t) l), d2p->single_lc[b][l]);       /* RAH, single_lc is returning an int32, %d expects an int16 */
        }
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# SSEQ %d (senid senid ...)\n", mdef->n_sseq);
    for (i = 0; i < mdef->n_sseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", mdef->sseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSSEQ %d (comstate comstate ...)\n", d2p->n_comsseq);
    for (i = 0; i < d2p->n_comsseq; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; j < mdef_n_emit_state(mdef); j++)
            fprintf(fp, " %5d", d2p->comsseq[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");

    fprintf(fp, "# COMSTATE %d (senid senid ...)\n", d2p->n_comstate);
    for (i = 0; i < d2p->n_comstate; i++) {
        fprintf(fp, "%5d ", i);
        for (j = 0; IS_S3SENID(d2p->comstate[i][j]); j++)
            fprintf(fp, " %5d", d2p->comstate[i][j]);
        fprintf(fp, "\n");
    }
    fprintf(fp, "#\n");
    fprintf(fp, "# END\n");

    fflush(fp);
}